

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall spvtools::opt::Function::ReorderBasicBlocksInStructuredOrder(Function *this)

{
  CFG *this_00;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  _List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> local_28;
  
  local_28._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_28;
  local_28._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_28;
  local_28._M_impl._M_node._M_size = 0;
  this_00 = IRContext::cfg(((this->def_inst_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl
                           )->context_);
  CFG::ComputeStructuredOrder
            (this_00,this,
             (BasicBlock *)
             (((this->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t,(list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&local_28);
  ReorderBasicBlocks<std::_List_iterator<spvtools::opt::BasicBlock*>>
            (this,(_List_iterator<spvtools::opt::BasicBlock_*>)
                  local_28._M_impl._M_node.super__List_node_base._M_next,
             (_List_node_base *)&local_28);
  std::__cxx11::
  _List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::_M_clear
            (&local_28);
  return;
}

Assistant:

void Function::ReorderBasicBlocksInStructuredOrder() {
  std::list<BasicBlock*> order;
  IRContext* context = this->def_inst_->context();
  context->cfg()->ComputeStructuredOrder(this, blocks_[0].get(), &order);
  ReorderBasicBlocks(order.begin(), order.end());
}